

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

void BinaryCache::RemoveImportPath(char *path)

{
  char *__s1;
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = importPaths;
  uVar3 = (ulong)DAT_0022d28c;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      __s1 = *(char **)(lVar1 + uVar4 * 8);
      iVar2 = strcmp(__s1,path);
      if (iVar2 == 0) {
        (*(code *)NULLC::dealloc)(__s1);
        if (DAT_0022d28c == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x62,
                        "T &FastVector<char *>::back() [T = char *, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if ((uint)uVar4 < DAT_0022d28c) {
          *(undefined8 *)(importPaths + uVar4 * 8) =
               *(undefined8 *)(importPaths + (ulong)(DAT_0022d28c - 1) * 8);
          DAT_0022d28c = DAT_0022d28c - 1;
          return;
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<char *>::operator[](unsigned int) [T = char *, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return;
}

Assistant:

void BinaryCache::RemoveImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
		{
			NULLC::dealloc(importPaths[i]);

			importPaths[i] = importPaths.back();
			importPaths.pop_back();
			return;
		}
	}
}